

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::ArticulatedPart::operator==(ArticulatedPart *this,ArticulatedPart *Value)

{
  if (((((this->super_VariableParameter).m_ui8VarParamType ==
         (Value->super_VariableParameter).m_ui8VarParamType) &&
       (this->m_ui8ParmeterChange == Value->m_ui8ParmeterChange)) &&
      (this->m_ui16AttachementID == Value->m_ui16AttachementID)) &&
     (this->m_ui32ParamTypeVariant == Value->m_ui32ParamTypeVariant)) {
    return (KBOOL)(-((float)Value->m_f32ParamValue == (float)this->m_f32ParamValue) & 1);
  }
  return false;
}

Assistant:

KBOOL ArticulatedPart::operator == ( const ArticulatedPart & Value ) const
{
    if( m_ui8VarParamType      != Value.m_ui8VarParamType )      return false;
    if( m_ui8ParmeterChange    != Value.m_ui8ParmeterChange )    return false;
    if( m_ui16AttachementID    != Value.m_ui16AttachementID )    return false;
    if( m_ui32ParamTypeVariant != Value.m_ui32ParamTypeVariant ) return false;
    if( m_f32ParamValue        != Value.m_f32ParamValue )        return false;
    return true;
}